

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

bool google::protobuf::internal::WireFormat::ParseAndMergeField
               (uint32_t tag,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  byte bVar1;
  ushort uVar2;
  byte *pbVar3;
  double *pdVar4;
  uint8_t *puVar5;
  char *pcVar6;
  int32_t *piVar7;
  float *pfVar8;
  uint32_t *puVar9;
  bool bVar10;
  bool bVar11;
  CppStringType CVar12;
  Limit limit;
  int iVar13;
  UnknownFieldSet *pUVar14;
  Message *pMVar15;
  int64_t iVar16;
  unsigned_long uVar17;
  uint64_t value_00;
  ulong uVar18;
  EnumDescriptor *this;
  EnumValueDescriptor *value_01;
  Reflection *this_00;
  uint32_t uVar19;
  uint first_byte_or_zero;
  _Alloc_hider _Var20;
  char *in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  undefined8 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  Metadata MVar25;
  pair<unsigned_long,_bool> pVar26;
  string_view field_name;
  string_view field_name_00;
  double value;
  anon_union_16_2_39e9c77e_for_Rep_0 local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  Limit local_b4;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  MVar25 = Message::GetMetadata(message);
  this_00 = MVar25.reflection;
  if (field == (FieldDescriptor *)0x0) {
LAB_0030b275:
    pUVar14 = Reflection::MutableUnknownFields(this_00,message);
    bVar10 = SkipField(input,tag,pUVar14);
    return bVar10;
  }
  bVar1 = field->type_;
  if ((tag & 7) != *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)bVar1 * 4)) {
    uVar18 = CONCAT71(0x48bb,field->field_0x1) & 0xffffffffffffff20;
    if (0xbf < (byte)field->field_0x1 == (bool)((byte)(uVar18 >> 5) & 7)) {
      if ((((tag & 7) != 2) || ((char)uVar18 == '\0')) || (0xfffffffb < bVar1 - 0xd))
      goto LAB_0030b275;
      pbVar3 = input->buffer_;
      if (input->buffer_end_ <= pbVar3) goto LAB_0030b86c;
      first_byte_or_zero = (uint)*pbVar3;
      if ((char)*pbVar3 < '\0') goto LAB_0030b86e;
      input->buffer_ = pbVar3 + 1;
    }
    else {
      ParseAndMergeField();
LAB_0030b86c:
      first_byte_or_zero = 0;
LAB_0030b86e:
      iVar16 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
      first_byte_or_zero = (uint)iVar16;
      if (iVar16 < 0) {
        return false;
      }
    }
    limit = io::CodedInputStream::PushLimit(input,first_byte_or_zero);
    switch(field->type_) {
    case '\x01':
      iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar13) {
        puVar5 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar5 < 8) {
          bVar10 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)local_d8.data)
          ;
          if (!bVar10) {
            return false;
          }
          uVar23 = (undefined4)local_d8.as_tree.cordz_info;
          uVar24 = (undefined4)((ulong)local_d8._0_8_ >> 0x20);
        }
        else {
          uVar23 = (undefined4)*(undefined8 *)puVar5;
          uVar24 = (undefined4)((ulong)*(undefined8 *)puVar5 >> 0x20);
          input->buffer_ = puVar5 + 8;
        }
        Reflection::AddDouble(this_00,message,field,(double)CONCAT44(uVar24,uVar23));
        iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\x02':
      iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar13) {
        pfVar8 = (float *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pfVar8 < 4) {
          bVar10 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)local_d8.data)
          ;
          if (!bVar10) {
            return false;
          }
          uVar23 = local_d8.as_tree.cordz_info._0_4_;
        }
        else {
          uVar23 = *pfVar8;
          input->buffer_ = (uint8_t *)(pfVar8 + 1);
        }
        Reflection::AddFloat(this_00,message,field,(float)uVar23);
        iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\x03':
      while (iVar13 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar13) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) &&
           (uVar17 = (unsigned_long)(char)*puVar5, -1 < (long)uVar17)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          pVar26 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar17 = pVar26.first;
          if (((undefined1  [16])pVar26 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        Reflection::AddInt64(this_00,message,field,uVar17);
      }
      break;
    case '\x04':
      while (iVar13 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar13) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) &&
           (value_00 = (uint64_t)(char)*puVar5, -1 < (long)value_00)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          pVar26 = io::CodedInputStream::ReadVarint64Fallback(input);
          value_00 = pVar26.first;
          if (((undefined1  [16])pVar26 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        Reflection::AddUInt64(this_00,message,field,value_00);
      }
      break;
    case '\x05':
      while (iVar13 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar13) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar18 = (ulong)bVar1;
          uVar19 = (uint32_t)bVar1;
          if ((char)bVar1 < '\0') goto LAB_0030bac8;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar19 = 0;
LAB_0030bac8:
          uVar18 = io::CodedInputStream::ReadVarint32Fallback(input,uVar19);
          if ((long)uVar18 < 0) {
            return false;
          }
        }
        Reflection::AddInt32(this_00,message,field,(int32_t)uVar18);
      }
      break;
    case '\x06':
      iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar13) {
        pdVar4 = (double *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
          bVar10 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)local_d8.data)
          ;
          if (!bVar10) {
            return false;
          }
        }
        else {
          local_d8.as_tree.cordz_info = (cordz_info_t)*pdVar4;
          input->buffer_ = (uint8_t *)(pdVar4 + 1);
        }
        Reflection::AddUInt64(this_00,message,field,local_d8.as_tree.cordz_info);
        iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\a':
      iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar13) {
        puVar9 = (uint32_t *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar9 < 4) {
          bVar10 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)local_d8.data)
          ;
          if (!bVar10) {
            return false;
          }
          uVar23 = local_d8.as_tree.cordz_info._0_4_;
        }
        else {
          uVar23 = *puVar9;
          local_d8.as_tree.cordz_info._4_4_ =
               (undefined4)((ulong)local_d8.as_tree.cordz_info >> 0x20);
          local_d8.as_tree.cordz_info._0_4_ = uVar23;
          input->buffer_ = (uint8_t *)(puVar9 + 1);
        }
        Reflection::AddUInt32(this_00,message,field,uVar23);
        iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\b':
      while (iVar13 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar13) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) &&
           (uVar17 = (unsigned_long)(char)*puVar5, -1 < (long)uVar17)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          pVar26 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar17 = pVar26.first;
          if (((undefined1  [16])pVar26 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        Reflection::AddBool(this_00,message,field,uVar17 != 0);
      }
      break;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      goto LAB_0030be32;
    case '\r':
      while (iVar13 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar13) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar18 = (ulong)bVar1;
          uVar19 = (uint32_t)bVar1;
          if ((char)bVar1 < '\0') goto LAB_0030b978;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar19 = 0;
LAB_0030b978:
          uVar18 = io::CodedInputStream::ReadVarint32Fallback(input,uVar19);
          if ((long)uVar18 < 0) {
            return false;
          }
        }
        Reflection::AddUInt32(this_00,message,field,(uint32_t)uVar18);
      }
      break;
    case '\x0e':
      iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar13) {
        local_b4 = limit;
        do {
          pbVar3 = input->buffer_;
          if (pbVar3 < input->buffer_end_) {
            bVar1 = *pbVar3;
            uVar18 = (ulong)bVar1;
            uVar19 = (uint32_t)bVar1;
            if ((char)bVar1 < '\0') goto LAB_0030bd36;
            input->buffer_ = pbVar3 + 1;
          }
          else {
            uVar19 = 0;
LAB_0030bd36:
            uVar18 = io::CodedInputStream::ReadVarint32Fallback(input,uVar19);
            if ((long)uVar18 < 0) {
              return false;
            }
          }
          bVar10 = FieldDescriptor::legacy_enum_field_treated_as_closed(field);
          iVar13 = (int)uVar18;
          if (bVar10) {
            this = FieldDescriptor::enum_type(field);
            value_01 = EnumDescriptor::FindValueByNumber(this,iVar13);
            if (value_01 == (EnumValueDescriptor *)0x0) {
              pUVar14 = Reflection::MutableUnknownFields(this_00,message);
              UnknownFieldSet::AddVarint(pUVar14,tag >> 3,(long)iVar13);
            }
            else {
              Reflection::AddEnum(this_00,message,field,value_01);
            }
          }
          else {
            Reflection::AddEnumValue(this_00,message,field,iVar13);
          }
          limit = local_b4;
          iVar13 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar13);
      }
      break;
    case '\x0f':
      iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar13) {
        piVar7 = (int32_t *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)piVar7 < 4) {
          bVar10 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)local_d8.data)
          ;
          if (!bVar10) {
            return false;
          }
          uVar23 = local_d8.as_tree.cordz_info._0_4_;
        }
        else {
          uVar23 = *piVar7;
          input->buffer_ = (uint8_t *)(piVar7 + 1);
        }
        Reflection::AddInt32(this_00,message,field,uVar23);
        iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\x10':
      iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar13) {
        pdVar4 = (double *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
          bVar10 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)local_d8.data)
          ;
          uVar22 = local_d8.as_tree.cordz_info;
          if (!bVar10) {
            return false;
          }
        }
        else {
          uVar22 = *pdVar4;
          input->buffer_ = (uint8_t *)(pdVar4 + 1);
        }
        Reflection::AddInt64(this_00,message,field,uVar22);
        iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\x11':
      while (iVar13 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar13) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar18 = (ulong)bVar1;
          uVar19 = (uint32_t)bVar1;
          if ((char)bVar1 < '\0') goto LAB_0030b8cb;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar19 = 0;
LAB_0030b8cb:
          uVar18 = io::CodedInputStream::ReadVarint32Fallback(input,uVar19);
          if ((long)uVar18 < 0) {
            return false;
          }
        }
        Reflection::AddInt32
                  (this_00,message,field,-((uint)uVar18 & 1) ^ (uint)(uVar18 >> 1) & 0x7fffffff);
      }
      break;
    case '\x12':
      while (iVar13 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar13) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar18 = (ulong)(char)*puVar5, -1 < (long)uVar18)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          pVar26 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar18 = pVar26.first;
          if (((undefined1  [16])pVar26 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        Reflection::AddInt64(this_00,message,field,-(ulong)((uint)uVar18 & 1) ^ uVar18 >> 1);
      }
    }
    io::CodedInputStream::PopLimit(input,limit);
    return true;
  }
  switch((uint)bVar1) {
  case 1:
    bVar10 = WireFormatLite::
             ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                       (input,(double *)&local_d8);
    if (!bVar10) {
      return false;
    }
    bVar10 = FieldDescriptor::is_repeated(field);
    if (bVar10) {
      Reflection::AddDouble(this_00,message,field,(double)local_d8.as_tree.cordz_info);
      return true;
    }
    Reflection::SetDouble(this_00,message,field,(double)local_d8.as_tree.cordz_info);
    return true;
  case 2:
    bVar10 = WireFormatLite::
             ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                       (input,(float *)&local_d8);
    if (!bVar10) {
      return false;
    }
    bVar10 = FieldDescriptor::is_repeated(field);
    if (bVar10) {
      Reflection::AddFloat(this_00,message,field,(float)local_d8.as_tree.cordz_info._0_4_);
    }
    else {
      Reflection::SetFloat(this_00,message,field,(float)local_d8.as_tree.cordz_info._0_4_);
    }
    break;
  case 3:
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) &&
       (local_d8.as_tree.cordz_info = (cordz_info_t)(char)*puVar5, -1 < local_d8.as_tree.cordz_info)
       ) {
      input->buffer_ = puVar5 + 1;
    }
    else {
      pVar26 = io::CodedInputStream::ReadVarint64Fallback(input);
      local_d8.as_tree.cordz_info = pVar26.first;
      if (((undefined1  [16])pVar26 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    bVar10 = FieldDescriptor::is_repeated(field);
    goto LAB_0030b6cf;
  case 4:
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) && (uVar22 = SEXT18((char)*puVar5), -1 < (long)uVar22)) {
      input->buffer_ = puVar5 + 1;
    }
    else {
      pVar26 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar22 = pVar26.first;
      if (((undefined1  [16])pVar26 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    bVar10 = FieldDescriptor::is_repeated(field);
    goto LAB_0030b70f;
  case 5:
    bVar10 = WireFormatLite::
             ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                       (input,(int32_t *)local_d8.data);
    goto LAB_0030b30c;
  case 6:
    pdVar4 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
      bVar10 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)local_d8.data);
      if (!bVar10) {
        return false;
      }
    }
    else {
      local_d8.as_tree.cordz_info = (cordz_info_t)*pdVar4;
      input->buffer_ = (uint8_t *)(pdVar4 + 1);
    }
    bVar10 = FieldDescriptor::is_repeated(field);
    uVar22 = local_d8.as_tree.cordz_info;
LAB_0030b70f:
    if (bVar10 == false) {
      Reflection::SetUInt64(this_00,message,field,uVar22);
    }
    else {
      Reflection::AddUInt64(this_00,message,field,uVar22);
    }
    break;
  case 7:
    puVar5 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar5 < 4) {
      bVar10 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)local_d8.data);
      goto LAB_0030b345;
    }
    local_d8.as_tree.cordz_info._0_4_ = *(undefined4 *)puVar5;
    input->buffer_ = puVar5 + 4;
    goto LAB_0030b515;
  case 8:
    bVar10 = WireFormatLite::
             ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                       (input,(bool *)local_d8.data);
    if (!bVar10) {
      return false;
    }
    bVar10 = FieldDescriptor::is_repeated(field);
    if (bVar10) {
      Reflection::AddBool(this_00,message,field,(bool)local_d8.data[0]);
    }
    else {
      Reflection::SetBool(this_00,message,field,(bool)local_d8.data[0]);
    }
    break;
  case 9:
    bVar10 = FieldDescriptor::requires_utf8_validation(field);
    local_d8.as_tree.cordz_info = (cordz_info_t)&local_c8;
    local_d8.as_tree.rep = (CordRep *)0x0;
    local_c8._M_local_buf[0] = '\0';
    bVar11 = WireFormatLite::ReadBytes(input,(string *)&local_d8.as_tree);
    if (!bVar11) {
LAB_0030b652:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.as_tree.cordz_info == &local_c8) {
        return false;
      }
      operator_delete((void *)local_d8.as_tree.cordz_info,
                      CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
      return false;
    }
    pcVar6 = (field->all_names_).payload_;
    uVar2 = *(ushort *)(pcVar6 + 2);
    field_name._M_len = pcVar6 + ~(ulong)uVar2;
    if (bVar10) {
      field_name._M_str = in_R9;
      bVar10 = WireFormatLite::VerifyUtf8String
                         ((WireFormatLite *)local_d8.as_tree.cordz_info,
                          (char *)((ulong)local_d8.as_tree.rep & 0xffffffff),0,(uint)uVar2,
                          field_name);
      if (!bVar10) goto LAB_0030b652;
    }
    else {
      field_name_00._M_str = in_R9;
      field_name_00._M_len = (size_t)field_name._M_len;
      WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)local_d8.as_tree.cordz_info,
                 (char *)((ulong)local_d8.as_tree.rep & 0xffffffff),0,(uint)uVar2,field_name_00);
    }
    bVar10 = FieldDescriptor::is_repeated(field);
    if (bVar10) {
      paVar21 = &local_50.field_2;
      local_50._M_dataplus._M_p = (pointer)paVar21;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_d8.as_tree.cordz_info,
                 (local_d8.as_tree.rep)->storage + local_d8.as_tree.cordz_info + -0xd);
      Reflection::AddString(this_00,message,field,&local_50);
      _Var20._M_p = local_50._M_dataplus._M_p;
    }
    else {
      paVar21 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar21;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_d8.as_tree.cordz_info,
                 (local_d8.as_tree.rep)->storage + local_d8.as_tree.cordz_info + -0xd);
      Reflection::SetString(this_00,message,field,&local_70);
      _Var20._M_p = local_70._M_dataplus._M_p;
    }
    goto LAB_0030b827;
  case 10:
    bVar10 = FieldDescriptor::is_repeated(field);
    if (bVar10) {
      pMVar15 = Reflection::AddMessage(this_00,message,field,input->extension_factory_);
    }
    else {
      pMVar15 = Reflection::MutableMessage(this_00,message,field,input->extension_factory_);
    }
    bVar10 = WireFormatLite::ReadGroup<google::protobuf::Message>(tag >> 3,input,pMVar15);
    goto LAB_0030b69a;
  case 0xb:
    bVar10 = FieldDescriptor::is_repeated(field);
    if (bVar10) {
      pMVar15 = Reflection::AddMessage(this_00,message,field,input->extension_factory_);
    }
    else {
      pMVar15 = Reflection::MutableMessage(this_00,message,field,input->extension_factory_);
    }
    bVar10 = WireFormatLite::ReadMessage<google::protobuf::Message>(input,pMVar15);
LAB_0030b69a:
    if (bVar10 == false) {
      return false;
    }
    return true;
  case 0xc:
    CVar12 = FieldDescriptor::cpp_string_type(field);
    if (CVar12 == kCord) {
      local_d8.as_tree.cordz_info = 0;
      local_d8.as_tree.rep = (CordRep *)0x0;
      bVar10 = WireFormatLite::ReadBytes(input,(Cord *)&local_d8.as_tree);
      if (bVar10) {
        Reflection::SetString(this_00,message,field,(Cord *)&local_d8.as_tree);
        absl::lts_20250127::Cord::~Cord((Cord *)&local_d8.as_tree);
        return true;
      }
      absl::lts_20250127::Cord::~Cord((Cord *)&local_d8.as_tree);
      return false;
    }
    local_d8.as_tree.cordz_info = (cordz_info_t)&local_c8;
    local_d8.as_tree.rep = (CordRep *)0x0;
    local_c8._M_local_buf[0] = '\0';
    bVar10 = WireFormatLite::ReadBytes(input,(string *)&local_d8.as_tree);
    if (!bVar10) goto LAB_0030b652;
    bVar10 = FieldDescriptor::is_repeated(field);
    if (bVar10) {
      paVar21 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar21;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_d8.as_tree.cordz_info,
                 (local_d8.as_tree.rep)->storage + local_d8.as_tree.cordz_info + -0xd);
      Reflection::AddString(this_00,message,field,&local_90);
      _Var20._M_p = local_90._M_dataplus._M_p;
    }
    else {
      paVar21 = &local_b0.field_2;
      local_b0._M_dataplus._M_p = (pointer)paVar21;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_d8.as_tree.cordz_info,
                 (local_d8.as_tree.rep)->storage + local_d8.as_tree.cordz_info + -0xd);
      Reflection::SetString(this_00,message,field,&local_b0);
      _Var20._M_p = local_b0._M_dataplus._M_p;
    }
LAB_0030b827:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var20._M_p != paVar21) {
      operator_delete(_Var20._M_p,paVar21->_M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.as_tree.cordz_info != &local_c8) {
      operator_delete((void *)local_d8.as_tree.cordz_info,
                      CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
    }
    break;
  case 0xd:
    bVar10 = WireFormatLite::
             ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                       (input,(uint32_t *)local_d8.data);
LAB_0030b345:
    if (bVar10 == false) {
      return false;
    }
LAB_0030b515:
    bVar10 = FieldDescriptor::is_repeated(field);
    if (bVar10) {
      Reflection::AddUInt32(this_00,message,field,local_d8.as_tree.cordz_info._0_4_);
    }
    else {
      Reflection::SetUInt32(this_00,message,field,local_d8.as_tree.cordz_info._0_4_);
    }
    break;
  case 0xe:
    bVar10 = WireFormatLite::
             ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                       (input,(int *)local_d8.data);
    if (!bVar10) {
      return false;
    }
    bVar10 = FieldDescriptor::is_repeated(field);
    if (bVar10) {
      Reflection::AddEnumValue(this_00,message,field,local_d8.as_tree.cordz_info._0_4_);
    }
    else {
      Reflection::SetEnumValue(this_00,message,field,local_d8.as_tree.cordz_info._0_4_);
    }
    break;
  case 0xf:
    bVar10 = WireFormatLite::
             ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
                       (input,(int32_t *)local_d8.data);
    goto LAB_0030b30c;
  case 0x10:
    bVar10 = WireFormatLite::
             ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
                       (input,(int64_t *)local_d8.data);
    goto LAB_0030b45c;
  case 0x11:
    bVar10 = WireFormatLite::
             ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
                       (input,(int32_t *)local_d8.data);
LAB_0030b30c:
    if (bVar10 == false) {
LAB_0030be32:
      return false;
    }
    bVar10 = FieldDescriptor::is_repeated(field);
    if (bVar10) {
      Reflection::AddInt32(this_00,message,field,local_d8.as_tree.cordz_info._0_4_);
    }
    else {
      Reflection::SetInt32(this_00,message,field,local_d8.as_tree.cordz_info._0_4_);
    }
    break;
  case 0x12:
    bVar10 = WireFormatLite::
             ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
                       (input,(int64_t *)local_d8.data);
LAB_0030b45c:
    if (bVar10 == false) {
      return false;
    }
    bVar10 = FieldDescriptor::is_repeated(field);
LAB_0030b6cf:
    if (bVar10 != false) {
      Reflection::AddInt64(this_00,message,field,local_d8.as_tree.cordz_info);
      return true;
    }
    Reflection::SetInt64(this_00,message,field,local_d8.as_tree.cordz_info);
    return true;
  }
  return true;
}

Assistant:

bool WireFormat::ParseAndMergeField(
    uint32_t tag,
    const FieldDescriptor* field,  // May be nullptr for unknown
    Message* message, io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();

  enum { UNKNOWN, NORMAL_FORMAT, PACKED_FORMAT } value_format;

  if (field == nullptr) {
    value_format = UNKNOWN;
  } else if (WireFormatLite::GetTagWireType(tag) ==
             WireTypeForFieldType(field->type())) {
    value_format = NORMAL_FORMAT;
  } else if (field->is_packable() &&
             WireFormatLite::GetTagWireType(tag) ==
                 WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    value_format = PACKED_FORMAT;
  } else {
    // We don't recognize this field. Either the field number is unknown
    // or the wire type doesn't match. Put it in our unknown field set.
    value_format = UNKNOWN;
  }

  if (value_format == UNKNOWN) {
    return SkipField(input, tag,
                     message_reflection->MutableUnknownFields(message));
  } else if (value_format == PACKED_FORMAT) {
    uint32_t length;
    if (!input->ReadVarint32(&length)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(length);

    switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    while (input->BytesUntilLimit() > 0) {                                     \
      CPPTYPE value;                                                           \
      if (!WireFormatLite::ReadPrimitive<CPPTYPE,                              \
                                         WireFormatLite::TYPE_##TYPE>(input,   \
                                                                      &value)) \
        return false;                                                          \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);          \
    }                                                                          \
    break;                                                                     \
  }

      HANDLE_PACKED_TYPE(INT32, int32_t, Int32)
      HANDLE_PACKED_TYPE(INT64, int64_t, Int64)
      HANDLE_PACKED_TYPE(SINT32, int32_t, Int32)
      HANDLE_PACKED_TYPE(SINT64, int64_t, Int64)
      HANDLE_PACKED_TYPE(UINT32, uint32_t, UInt32)
      HANDLE_PACKED_TYPE(UINT64, uint64_t, UInt64)

      HANDLE_PACKED_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_PACKED_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_PACKED_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_PACKED_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_PACKED_TYPE(FLOAT, float, Float)
      HANDLE_PACKED_TYPE(DOUBLE, double, Double)

      HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value))
            return false;
          if (!field->legacy_enum_field_treated_as_closed()) {
            message_reflection->AddEnumValue(message, field, value);
          } else {
            const EnumValueDescriptor* enum_value =
                field->enum_type()->FindValueByNumber(value);
            if (enum_value != nullptr) {
              message_reflection->AddEnum(message, field, enum_value);
            } else {
              // The enum value is not one of the known values.  Add it to the
              // UnknownFieldSet.
              int64_t sign_extended_value = static_cast<int64_t>(value);
              message_reflection->MutableUnknownFields(message)->AddVarint(
                  WireFormatLite::GetTagFieldNumber(tag), sign_extended_value);
            }
          }
        }

        break;
      }

      case FieldDescriptor::TYPE_STRING:
      case FieldDescriptor::TYPE_GROUP:
      case FieldDescriptor::TYPE_MESSAGE:
      case FieldDescriptor::TYPE_BYTES:
        // Can't have packed fields of these types: these should be caught by
        // the protocol compiler.
        return false;
        break;
    }

    input->PopLimit(limit);
  } else {
    // Non-packed value (value_format == NORMAL_FORMAT)
    switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                            \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    CPPTYPE value;                                                            \
    if (!WireFormatLite::ReadPrimitive<CPPTYPE, WireFormatLite::TYPE_##TYPE>( \
            input, &value))                                                   \
      return false;                                                           \
    if (field->is_repeated()) {                                               \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);         \
    } else {                                                                  \
      message_reflection->Set##CPPTYPE_METHOD(message, field, value);         \
    }                                                                         \
    break;                                                                    \
  }

      HANDLE_TYPE(INT32, int32_t, Int32)
      HANDLE_TYPE(INT64, int64_t, Int64)
      HANDLE_TYPE(SINT32, int32_t, Int32)
      HANDLE_TYPE(SINT64, int64_t, Int64)
      HANDLE_TYPE(UINT32, uint32_t, UInt32)
      HANDLE_TYPE(UINT64, uint64_t, UInt64)

      HANDLE_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_TYPE(FLOAT, float, Float)
      HANDLE_TYPE(DOUBLE, double, Double)

      HANDLE_TYPE(BOOL, bool, Bool)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value))
          return false;
        if (field->is_repeated()) {
          message_reflection->AddEnumValue(message, field, value);
        } else {
          message_reflection->SetEnumValue(message, field, value);
        }
        break;
      }

      // Handle strings separately so that we can optimize the ctype=CORD case.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = field->requires_utf8_validation();
        std::string value;
        if (!WireFormatLite::ReadString(input, &value)) return false;
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                                WireFormatLite::PARSE,
                                                field->full_name())) {
            return false;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name());
        }
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
          absl::Cord value;
          if (!WireFormatLite::ReadBytes(input, &value)) return false;
          message_reflection->SetString(message, field, value);
          break;
        }
        std::string value;
        if (!WireFormatLite::ReadBytes(input, &value)) return false;
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadGroup(WireFormatLite::GetTagFieldNumber(tag),
                                       input, sub_message))
          return false;
        break;
      }

      case FieldDescriptor::TYPE_MESSAGE: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadMessage(input, sub_message)) return false;
        break;
      }
    }
  }

  return true;
}